

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archive.cpp
# Opt level: O0

void __thiscall celero::Archive::add(Archive *this,shared_ptr<celero::ExperimentResult> *x)

{
  double dVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  Impl *pIVar5;
  pointer pAVar6;
  uint64_t uVar7;
  pointer pAVar8;
  element_type *peVar9;
  element_type *this_00;
  Statistics<long> *pSVar10;
  double dVar11;
  string local_210;
  shared_ptr<celero::Benchmark> local_1f0;
  string local_1e0;
  Experiment *local_1c0;
  Experiment *experiment;
  ArchiveEntry r;
  shared_ptr<celero::ExperimentResult> local_40;
  __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
  local_30;
  __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
  local_28;
  __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
  local_20;
  __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_> found
  ;
  shared_ptr<celero::ExperimentResult> *x_local;
  Archive *this_local;
  
  found._M_current = (ArchiveEntry *)x;
  bVar4 = std::operator==(x,(nullptr_t)0x0);
  if (bVar4) {
    return;
  }
  pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
  local_28._M_current =
       (ArchiveEntry *)
       std::begin<std::vector<ArchiveEntry,std::allocator<ArchiveEntry>>>(&pIVar5->results);
  pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
  local_30._M_current =
       (ArchiveEntry *)
       std::end<std::vector<ArchiveEntry,std::allocator<ArchiveEntry>>>(&pIVar5->results);
  std::shared_ptr<celero::ExperimentResult>::shared_ptr(&local_40,x);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<ArchiveEntry*,std::vector<ArchiveEntry,std::allocator<ArchiveEntry>>>,celero::Archive::add(std::shared_ptr<celero::ExperimentResult>)::__0>
                       (local_28,local_30,(anon_class_16_1_54a39818_for__M_pred *)&local_40);
  add(std::shared_ptr<celero::ExperimentResult>)::$_0::~__0((__0 *)&local_40);
  pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
  r._344_8_ = std::end<std::vector<ArchiveEntry,std::allocator<ArchiveEntry>>>(&pIVar5->results);
  bVar4 = __gnu_cxx::operator!=
                    (&local_20,
                     (__normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
                      *)&r.Failure);
  if (!bVar4) {
    ArchiveEntry::ArchiveEntry((ArchiveEntry *)&experiment);
    peVar9 = std::
             __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)x);
    local_1c0 = ExperimentResult::getExperiment(peVar9);
    if (local_1c0 != (Experiment *)0x0) {
      Experiment::getBenchmark((Experiment *)&local_1f0);
      this_00 = std::
                __shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_1f0);
      Benchmark::getName_abi_cxx11_(&local_1e0,this_00);
      std::__cxx11::string::operator=((string *)&experiment,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::shared_ptr<celero::Benchmark>::~shared_ptr(&local_1f0);
      Experiment::getName_abi_cxx11_(&local_210,local_1c0);
      std::__cxx11::string::operator=
                ((string *)(r.GroupName.field_2._M_local_buf + 8),(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.CurrentStats.Max._0_1_ = ExperimentResult::getFailure(peVar9);
      pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
      r.ExperimentValueScale = (double)Impl::now(pIVar5);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r._88_8_ = ExperimentResult::getBaselineMeasurement(peVar9);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.RunName.field_2._8_8_ = ExperimentResult::getProblemSpaceValue(peVar9);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.ExperimentValue = (int64_t)ExperimentResult::getProblemSpaceValueScale(peVar9);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      bVar4 = ExperimentResult::getFailure(peVar9);
      r.FirstRanDate._0_4_ = (byte)~bVar4 & 1;
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.MaxStats.Max = (uint64_t)ExperimentResult::getBaselineMeasurement(peVar9);
      r.CurrentBaseline = r.ExperimentValueScale;
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      pSVar10 = ExperimentResult::getTimeStatistics(peVar9);
      ArchiveEntry::Stat::operator=((Stat *)&r.CurrentBaseline_TimeSinceEpoch,pSVar10);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.MinStats.Max = (uint64_t)ExperimentResult::getBaselineMeasurement(peVar9);
      r.MaxBaseline = r.ExperimentValueScale;
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      pSVar10 = ExperimentResult::getTimeStatistics(peVar9);
      ArchiveEntry::Stat::operator=((Stat *)&r.MaxBaseline_TimeSinceEpoch,pSVar10);
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      r.AverageBaseline = ExperimentResult::getBaselineMeasurement(peVar9);
      r.MinBaseline = r.ExperimentValueScale;
      peVar9 = std::
               __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)x);
      pSVar10 = ExperimentResult::getTimeStatistics(peVar9);
      ArchiveEntry::Stat::operator=((Stat *)&r.MinBaseline_TimeSinceEpoch,pSVar10);
      pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
      std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>::push_back
                (&pIVar5->results,(value_type *)&experiment);
    }
    ArchiveEntry::~ArchiveEntry((ArchiveEntry *)&experiment);
    goto LAB_00183ef4;
  }
  peVar9 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  bVar4 = ExperimentResult::getFailure(peVar9);
  if (bVar4) {
    return;
  }
  peVar9 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  dVar11 = ExperimentResult::getBaselineMeasurement(peVar9);
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  pAVar6->CurrentBaseline = dVar11;
  pIVar5 = Pimpl<celero::Archive::Impl>::operator->(&this->pimpl);
  uVar7 = Impl::now(pIVar5);
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  pAVar6->CurrentBaseline_TimeSinceEpoch = uVar7;
  peVar9 = std::
           __shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)x);
  pSVar10 = ExperimentResult::getTimeStatistics(peVar9);
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  ArchiveEntry::Stat::operator=(&pAVar6->CurrentStats,pSVar10);
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  if ((pAVar6->Failure & 1U) == 0) {
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    if (dVar11 <= pAVar6->MinBaseline) goto LAB_001838b9;
  }
  else {
LAB_001838b9:
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->MinBaseline = dVar11;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    uVar7 = pAVar6->CurrentBaseline_TimeSinceEpoch;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->MinBaseline_TimeSinceEpoch = uVar7;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar8 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    memcpy(&pAVar8->MinStats,&pAVar6->CurrentStats,0x40);
  }
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  if ((pAVar6->Failure & 1U) == 0) {
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    if (pAVar6->MaxBaseline <= dVar11) goto LAB_00183994;
  }
  else {
LAB_00183994:
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->MaxBaseline = dVar11;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    uVar7 = pAVar6->CurrentBaseline_TimeSinceEpoch;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->MaxBaseline_TimeSinceEpoch = uVar7;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar8 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    memcpy(&pAVar8->MaxStats,&pAVar6->CurrentStats,0x40);
  }
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  if ((pAVar6->Failure & 1U) == 0) {
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->AverageBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    uVar2 = pAVar6->TotalSamplesCollected;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar1 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    uVar3 = pAVar6->TotalSamplesCollected;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->AverageBaseline = (dVar11 * (double)uVar2 + dVar1) / (double)(uVar3 + 1);
  }
  else {
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    dVar11 = pAVar6->CurrentBaseline;
    pAVar6 = __gnu_cxx::
             __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
             ::operator->(&local_20);
    pAVar6->AverageBaseline = dVar11;
  }
  pAVar6 = __gnu_cxx::
           __normal_iterator<ArchiveEntry_*,_std::vector<ArchiveEntry,_std::allocator<ArchiveEntry>_>_>
           ::operator->(&local_20);
  pAVar6->TotalSamplesCollected = pAVar6->TotalSamplesCollected + 1;
LAB_00183ef4:
  save(this);
  return;
}

Assistant:

void Archive::add(std::shared_ptr<celero::ExperimentResult> x)
{
	if(x == nullptr)
	{
		return;
	}

	const auto found = std::find_if(std::begin(this->pimpl->results), std::end(this->pimpl->results), [x](const ArchiveEntry& r) -> bool {
		return (r.GroupName == x->getExperiment()->getBenchmark()->getName()) && (r.RunName == x->getExperiment()->getName())
			   && (r.ExperimentValue == x->getProblemSpaceValue());
	});

	if(found != std::end(this->pimpl->results))
	{
		if(x->getFailure() == true)
		{
			return;
		}

		found->CurrentBaseline = x->getBaselineMeasurement();
		found->CurrentBaseline_TimeSinceEpoch = this->pimpl->now();
		found->CurrentStats = x->getTimeStatistics();

		if(found->Failure || found->CurrentBaseline <= found->MinBaseline)
		{
			found->MinBaseline = found->CurrentBaseline;
			found->MinBaseline_TimeSinceEpoch = found->CurrentBaseline_TimeSinceEpoch;
			found->MinStats = found->CurrentStats;
		}

		if(found->Failure || found->CurrentBaseline >= found->MaxBaseline)
		{
			found->MaxBaseline = found->CurrentBaseline;
			found->MaxBaseline_TimeSinceEpoch = found->CurrentBaseline_TimeSinceEpoch;
			found->MaxStats = found->CurrentStats;
		}

		// This is not good IEEE math.
		if(found->Failure == false)
		{
			found->AverageBaseline =
				((found->AverageBaseline * found->TotalSamplesCollected) + found->CurrentBaseline) / (found->TotalSamplesCollected + 1);
		}
		else
		{
			found->AverageBaseline = found->CurrentBaseline;
		}

		found->TotalSamplesCollected++;
	}
	else
	{
		ArchiveEntry r;

		const auto experiment = x->getExperiment();

		if(experiment != nullptr)
		{
			r.GroupName = experiment->getBenchmark()->getName();
			r.RunName = experiment->getName();
			r.Failure = x->getFailure();
			r.FirstRanDate = this->pimpl->now();
			r.AverageBaseline = x->getBaselineMeasurement();
			r.ExperimentValue = x->getProblemSpaceValue();
			r.ExperimentValueScale = x->getProblemSpaceValueScale();
			r.TotalSamplesCollected = x->getFailure() ? 0 : 1;

			r.CurrentBaseline = x->getBaselineMeasurement();
			r.CurrentBaseline_TimeSinceEpoch = r.FirstRanDate;
			r.CurrentStats = x->getTimeStatistics();

			r.MaxBaseline = x->getBaselineMeasurement();
			r.MaxBaseline_TimeSinceEpoch = r.FirstRanDate;
			r.MaxStats = x->getTimeStatistics();

			r.MinBaseline = x->getBaselineMeasurement();
			r.MinBaseline_TimeSinceEpoch = r.FirstRanDate;
			r.MinStats = x->getTimeStatistics();

			this->pimpl->results.push_back(r);
		}
	}

	this->save();
}